

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

iterator __thiscall
QVLABase<int>::erase(QVLABase<int> *this,const_iterator abegin,const_iterator aend)

{
  qsizetype *pqVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  pvVar2 = (this->super_QVLABaseBase).ptr;
  lVar4 = (long)abegin - (long)pvVar2;
  lVar3 = (long)aend - (long)pvVar2 >> 2;
  lVar5 = (lVar4 >> 2) - lVar3;
  if (lVar5 != 0) {
    memmove((void *)((long)pvVar2 + lVar4),(void *)(((long)aend - (long)pvVar2) + (long)pvVar2),
            ((this->super_QVLABaseBase).s - lVar3) * 4);
    pqVar1 = &(this->super_QVLABaseBase).s;
    *pqVar1 = *pqVar1 + lVar5;
    pvVar2 = (this->super_QVLABaseBase).ptr;
  }
  return (iterator)((long)pvVar2 + lVar4);
}

Assistant:

Q_OUTOFLINE_TEMPLATE auto QVLABase<T>::erase(const_iterator abegin, const_iterator aend) -> iterator
{
    Q_ASSERT_X(isValidIterator(abegin), "QVarLengthArray::erase", "The specified const_iterator argument 'abegin' is invalid");
    Q_ASSERT_X(isValidIterator(aend), "QVarLengthArray::erase", "The specified const_iterator argument 'aend' is invalid");

    qsizetype f = qsizetype(abegin - cbegin());
    qsizetype l = qsizetype(aend - cbegin());
    qsizetype n = l - f;

    if (n == 0) // avoid UB in std::move() below
        return data() + f;

    Q_ASSERT(n > 0); // aend must be reachable from abegin

    if constexpr (!QTypeInfo<T>::isRelocatable) {
        std::move(begin() + l, end(), QT_MAKE_CHECKED_ARRAY_ITERATOR(begin() + f, size() - f));
        std::destroy(end() - n, end());
    } else {
        std::destroy(abegin, aend);
        memmove(static_cast<void *>(data() + f), static_cast<const void *>(data() + l), (size() - l) * sizeof(T));
    }
    this->s -= n;
    return data() + f;
}